

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

_Bool bitset_grow(bitset_t *bitset,size_t newarraysize)

{
  ulong uVar1;
  uint64_t *puVar2;
  ulong uVar3;
  
  uVar3 = bitset->arraysize;
  if (newarraysize >> 0x3a != 0 || newarraysize < uVar3) {
    return false;
  }
  uVar1 = bitset->capacity;
  if (uVar1 < newarraysize) {
    uVar3 = uVar1 + (uVar1 == 0);
    do {
      uVar1 = uVar3;
      uVar3 = uVar1 * 2;
    } while (uVar1 < newarraysize);
    puVar2 = (uint64_t *)realloc(bitset->array,uVar1 * 8);
    if (puVar2 == (uint64_t *)0x0) {
      return false;
    }
    bitset->capacity = uVar1;
    bitset->array = puVar2;
    uVar3 = bitset->arraysize;
  }
  else {
    puVar2 = bitset->array;
  }
  memset(puVar2 + uVar3,0,(newarraysize - uVar3) * 8);
  bitset->arraysize = newarraysize;
  return true;
}

Assistant:

bool bitset_grow(bitset_t *bitset,  size_t newarraysize) {
  if(newarraysize < bitset->arraysize) { return false; }
  if(newarraysize > SIZE_MAX/64) { return false; }
  if (bitset->capacity < newarraysize) {
    uint64_t *newarray;
    size_t newcapacity = bitset->capacity;
    if(newcapacity == 0) { newcapacity = 1; }
    while(newcapacity < newarraysize) { newcapacity *= 2; }
    if ((newarray = (uint64_t *) realloc(bitset->array, sizeof(uint64_t) * newcapacity)) == NULL) {
      return false;
    }
    bitset->capacity = newcapacity;
    bitset->array = newarray;
  }
  memset(bitset->array + bitset->arraysize, 0, sizeof(uint64_t) * (newarraysize - bitset->arraysize));
  bitset->arraysize = newarraysize;
  return true; // success!
}